

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.h
# Opt level: O0

void __thiscall ArmipsArguments::ArmipsArguments(ArmipsArguments *this)

{
  ArmipsArguments *this_local;
  
  std::vector<EquationDefinition,_std::allocator<EquationDefinition>_>::vector(&this->equList);
  std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>::vector(&this->labels);
  ghc::filesystem::path::path(&this->inputFileName);
  ghc::filesystem::path::path(&this->tempFileName);
  ghc::filesystem::path::path(&this->symFileName);
  std::shared_ptr<AssemblerFile>::shared_ptr(&this->memoryFile);
  std::__cxx11::string::string((string *)&this->content);
  this->mode = FILE;
  this->symFileVersion = 0;
  this->errorOnWarning = false;
  this->silent = false;
  this->showStats = false;
  this->errorsResult =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  this->useAbsoluteFileNames = true;
  return;
}

Assistant:

ArmipsArguments()
	{
		mode = ArmipsMode::FILE;
		symFileVersion = 0;
		errorOnWarning = false;
		silent = false;
		showStats = false;
		errorsResult = nullptr;
		useAbsoluteFileNames = true;
	}